

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_core_module.c
# Opt level: O3

ngx_int_t ngx_http_get_forwarded_addr_internal
                    (ngx_http_request_t *r,ngx_addr_t *addr,u_char *xff,size_t xfflen,
                    ngx_array_t *proxies,int recursive)

{
  ngx_int_t nVar1;
  ngx_int_t nVar2;
  u_char *puVar3;
  u_char *text;
  undefined1 auStack_70 [8];
  ngx_addr_t paddr;
  
  nVar1 = ngx_cidr_match(addr->sockaddr,proxies);
  nVar2 = -5;
  if (nVar1 == 0) {
    puVar3 = xff + (xfflen - 1);
    text = puVar3;
    if (puVar3 <= xff) {
joined_r0x0013c4a2:
      do {
        if (puVar3 <= xff) goto LAB_0013c4c2;
        if ((*puVar3 == ',') || (*puVar3 == ' ')) {
          text = puVar3 + 1;
          goto LAB_0013c4c2;
        }
        puVar3 = puVar3 + -1;
        text = xff;
      } while( true );
    }
    do {
      if ((*puVar3 != ',') && (text = puVar3, *puVar3 != ' ')) goto joined_r0x0013c4a2;
      xfflen = xfflen - 1;
      puVar3 = puVar3 + -1;
    } while (xff < puVar3);
    xfflen = 1;
    text = xff;
LAB_0013c4c2:
    paddr.name.data = (u_char *)proxies;
    nVar1 = ngx_parse_addr_port(r->pool,(ngx_addr_t *)auStack_70,text,
                                (size_t)(xff + (xfflen - (long)text)));
    nVar2 = -5;
    if (nVar1 == 0) {
      (addr->name).len = paddr._8_8_;
      (addr->name).data = (u_char *)paddr.name.len;
      addr->sockaddr = (sockaddr *)auStack_70;
      *(sockaddr **)&addr->socklen = paddr.sockaddr;
      nVar2 = 0;
      if ((recursive != 0) && (xff < text)) {
        nVar1 = ngx_http_get_forwarded_addr_internal
                          (r,addr,xff,(size_t)(text + ~(ulong)xff),(ngx_array_t *)paddr.name.data,1)
        ;
        nVar2 = -4;
        if (nVar1 != -5) {
          nVar2 = nVar1;
        }
      }
    }
  }
  return nVar2;
}

Assistant:

static ngx_int_t
ngx_http_get_forwarded_addr_internal(ngx_http_request_t *r, ngx_addr_t *addr,
    u_char *xff, size_t xfflen, ngx_array_t *proxies, int recursive)
{
    u_char      *p;
    ngx_int_t    rc;
    ngx_addr_t   paddr;

    if (ngx_cidr_match(addr->sockaddr, proxies) != NGX_OK) {
        return NGX_DECLINED;
    }

    for (p = xff + xfflen - 1; p > xff; p--, xfflen--) {
        if (*p != ' ' && *p != ',') {
            break;
        }
    }

    for ( /* void */ ; p > xff; p--) {
        if (*p == ' ' || *p == ',') {
            p++;
            break;
        }
    }

    if (ngx_parse_addr_port(r->pool, &paddr, p, xfflen - (p - xff)) != NGX_OK) {
        return NGX_DECLINED;
    }

    *addr = paddr;

    if (recursive && p > xff) {
        rc = ngx_http_get_forwarded_addr_internal(r, addr, xff, p - 1 - xff,
                                                  proxies, 1);

        if (rc == NGX_DECLINED) {
            return NGX_DONE;
        }

        /* rc == NGX_OK || rc == NGX_DONE  */
        return rc;
    }

    return NGX_OK;
}